

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grammar.capnp.h
# Opt level: O0

void __thiscall
capnp::compiler::Declaration::Id::Builder::adoptUid
          (Builder *this,Orphan<capnp::compiler::LocatedInteger> *value)

{
  PointerBuilder builder;
  uint uVar1;
  Orphan<capnp::compiler::LocatedInteger> *value_00;
  PointerBuilder local_30;
  Orphan<capnp::compiler::LocatedInteger> *local_18;
  Orphan<capnp::compiler::LocatedInteger> *value_local;
  Builder *this_local;
  
  local_18 = value;
  value_local = (Orphan<capnp::compiler::LocatedInteger> *)this;
  uVar1 = bounded<0u>();
  capnp::_::StructBuilder::setDataField<capnp::compiler::Declaration::Id::Which>
            (&this->_builder,uVar1,UID);
  uVar1 = bounded<1u>();
  capnp::_::StructBuilder::getPointerField(&local_30,&this->_builder,uVar1);
  value_00 = kj::mv<capnp::Orphan<capnp::compiler::LocatedInteger>>(local_18);
  builder.capTable = local_30.capTable;
  builder.segment = local_30.segment;
  builder.pointer = local_30.pointer;
  capnp::_::PointerHelpers<capnp::compiler::LocatedInteger,_(capnp::Kind)3>::adopt(builder,value_00)
  ;
  return;
}

Assistant:

inline void Declaration::Id::Builder::adoptUid(
    ::capnp::Orphan< ::capnp::compiler::LocatedInteger>&& value) {
  _builder.setDataField<Declaration::Id::Which>(
      ::capnp::bounded<0>() * ::capnp::ELEMENTS, Declaration::Id::UID);
  ::capnp::_::PointerHelpers< ::capnp::compiler::LocatedInteger>::adopt(_builder.getPointerField(
      ::capnp::bounded<1>() * ::capnp::POINTERS), kj::mv(value));
}